

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_qr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  int iVar1;
  ulong uVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  REF_DBL RVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  REF_DBL *local_78;
  ulong local_68;
  REF_DBL *local_60;
  
  if (n < 1) {
    return 0;
  }
  uVar11 = (ulong)(uint)m;
  uVar10 = (ulong)(uint)n;
  uVar7 = 0;
  pRVar3 = a;
  pRVar4 = q;
  do {
    if (0 < m) {
      uVar9 = 0;
      do {
        pRVar4[uVar9] = pRVar3[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    uVar7 = uVar7 + 1;
    pRVar4 = pRVar4 + uVar11;
    pRVar3 = pRVar3 + uVar11;
  } while (uVar7 != uVar10);
  if (0 < n) {
    uVar9 = 0;
    uVar7 = uVar10;
    do {
      memset(r + uVar9,0,uVar10 * 8);
      uVar9 = (ulong)(uint)((int)uVar9 + n);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    if (0 < n) {
      local_78 = a + uVar11;
      local_60 = q + uVar11;
      local_68 = 1;
      uVar9 = 0;
      uVar7 = 0;
      do {
        iVar1 = (n + 1) * (int)uVar7;
        dVar12 = r[iVar1];
        if (m < 1) {
          if (dVar12 < 0.0) {
            RVar13 = sqrt(dVar12);
          }
          else {
            RVar13 = SQRT(dVar12);
          }
          r[iVar1] = RVar13;
        }
        else {
          uVar2 = 0;
          do {
            dVar12 = dVar12 + q[uVar9 + uVar2] * q[uVar9 + uVar2];
            r[iVar1] = dVar12;
            uVar2 = uVar2 + 1;
          } while (uVar11 != uVar2);
          dVar12 = r[iVar1];
          if (dVar12 < 0.0) {
            RVar13 = sqrt(dVar12);
          }
          else {
            RVar13 = SQRT(dVar12);
          }
          r[iVar1] = RVar13;
          if (0 < m) {
            uVar2 = 0;
            do {
              auVar14._0_8_ = r[iVar1] * 1e+20;
              dVar12 = q[uVar9 + uVar2];
              auVar14._8_8_ = dVar12;
              auVar15._8_8_ = -dVar12;
              auVar15._0_8_ = -auVar14._0_8_;
              auVar15 = maxpd(auVar14,auVar15);
              if (auVar15._0_8_ <= auVar15._8_8_) {
                return 4;
              }
              q[uVar9 + uVar2] = dVar12 / r[iVar1];
              uVar2 = uVar2 + 1;
            } while (uVar11 != uVar2);
          }
        }
        uVar2 = uVar7 + 1;
        pRVar3 = local_60;
        pRVar4 = local_78;
        uVar5 = local_68;
        if (uVar2 < uVar10) {
          do {
            if (0 < m) {
              lVar6 = uVar5 * uVar10;
              RVar13 = r[uVar7 + lVar6];
              uVar8 = 0;
              do {
                RVar13 = RVar13 + pRVar4[uVar8] * q[uVar9 + uVar8];
                r[uVar7 + lVar6] = RVar13;
                uVar8 = uVar8 + 1;
              } while (uVar11 != uVar8);
              if (0 < m) {
                uVar8 = 0;
                do {
                  pRVar3[uVar8] = pRVar3[uVar8] - r[uVar7 + lVar6] * q[uVar9 + uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar11 != uVar8);
              }
            }
            uVar5 = uVar5 + 1;
            pRVar3 = pRVar3 + uVar11;
            pRVar4 = pRVar4 + uVar11;
          } while (uVar5 != uVar10);
        }
        local_68 = local_68 + 1;
        uVar9 = (ulong)(uint)((int)uVar9 + m);
        local_78 = local_78 + uVar11;
        local_60 = local_60 + uVar11;
        uVar7 = uVar2;
      } while (uVar2 != uVar10);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_qr(REF_INT m, REF_INT n, REF_DBL *a, REF_DBL *q,
                                 REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < m; i++) q[i + m * j] = a[i + m * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) r[i + n * j] = 0.0;

  for (k = 0; k < n; k++) {
    for (i = 0; i < m; i++) r[k + n * k] += q[i + m * k] * q[i + m * k];
    r[k + n * k] = sqrt(r[k + n * k]);
    for (i = 0; i < m; i++) {
      if (!ref_math_divisible(q[i + m * k], r[k + n * k])) {
        return REF_DIV_ZERO;
      }
      q[i + m * k] /= r[k + n * k];
    }
    for (j = k + 1; j < n; j++) {
      for (i = 0; i < m; i++) r[k + n * j] += a[i + m * j] * q[i + m * k];
      for (i = 0; i < m; i++) q[i + m * j] -= r[k + n * j] * q[i + m * k];
    }
  }

  return REF_SUCCESS;
}